

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int start_page_no_capturepattern(vorb *f)

{
  uint8 uVar1;
  byte bVar2;
  uint uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  vorb *in_RDI;
  int len;
  int i_1;
  int i;
  uint32 n;
  uint32 loc1;
  uint32 loc0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int iVar8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  if (in_RDI->first_decode != '\0') {
    uVar3 = stb_vorbis_get_file_offset
                      ((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    (in_RDI->p_first).page_start = uVar3 - 4;
  }
  uVar1 = get8((vorb *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (uVar1 == '\0') {
    uVar1 = get8((vorb *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    in_RDI->page_flag = uVar1;
    uVar4 = get32((vorb *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    uVar5 = get32((vorb *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    get32((vorb *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    uVar6 = get32((vorb *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    in_RDI->last_page = uVar6;
    get32((vorb *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
    bVar2 = get8((vorb *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    in_RDI->segment_count = (uint)bVar2;
    iVar7 = getn((vorb *)CONCAT44(uVar4,uVar5),(uint8 *)CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
    if (iVar7 == 0) {
      local_4 = error(in_RDI,VORBIS_unexpected_eof);
    }
    else {
      in_RDI->end_seg_with_known_loc = -2;
      if ((uVar4 != 0xffffffff) || (uVar5 != 0xffffffff)) {
        iVar7 = in_RDI->segment_count;
        do {
          iVar7 = iVar7 + -1;
          if (iVar7 < 0) break;
        } while (in_RDI->segments[iVar7] == 0xff);
        if (-1 < iVar7) {
          in_RDI->end_seg_with_known_loc = iVar7;
          in_RDI->known_loc_for_packet = uVar4;
        }
      }
      if (in_RDI->first_decode != '\0') {
        iVar7 = 0;
        for (iVar8 = 0; iVar8 < in_RDI->segment_count; iVar8 = iVar8 + 1) {
          iVar7 = (uint)in_RDI->segments[iVar8] + iVar7;
        }
        (in_RDI->p_first).page_end =
             (in_RDI->p_first).page_start + in_RDI->segment_count + 0x1b + iVar7;
        (in_RDI->p_first).last_decoded_sample = uVar4;
      }
      in_RDI->next_seg = 0;
      local_4 = 1;
    }
  }
  else {
    local_4 = error(in_RDI,VORBIS_invalid_stream_structure_version);
  }
  return local_4;
}

Assistant:

static int start_page_no_capturepattern(vorb *f)
{
   uint32 loc0,loc1,n;
   if (f->first_decode && !IS_PUSH_MODE(f)) {
      f->p_first.page_start = stb_vorbis_get_file_offset(f) - 4;
   }
   // stream structure version
   if (0 != get8(f)) return error(f, VORBIS_invalid_stream_structure_version);
   // header flag
   f->page_flag = get8(f);
   // absolute granule position
   loc0 = get32(f);
   loc1 = get32(f);
   // @TODO: validate loc0,loc1 as valid positions?
   // stream serial number -- vorbis doesn't interleave, so discard
   get32(f);
   //if (f->serial != get32(f)) return error(f, VORBIS_incorrect_stream_serial_number);
   // page sequence number
   n = get32(f);
   f->last_page = n;
   // CRC32
   get32(f);
   // page_segments
   f->segment_count = get8(f);
   if (!getn(f, f->segments, f->segment_count))
      return error(f, VORBIS_unexpected_eof);
   // assume we _don't_ know any the sample position of any segments
   f->end_seg_with_known_loc = -2;
   if (loc0 != ~0U || loc1 != ~0U) {
      int i;
      // determine which packet is the last one that will complete
      for (i=f->segment_count-1; i >= 0; --i)
         if (f->segments[i] < 255)
            break;
      // 'i' is now the index of the _last_ segment of a packet that ends
      if (i >= 0) {
         f->end_seg_with_known_loc = i;
         f->known_loc_for_packet   = loc0;
      }
   }
   if (f->first_decode) {
      int i,len;
      len = 0;
      for (i=0; i < f->segment_count; ++i)
         len += f->segments[i];
      len += 27 + f->segment_count;
      f->p_first.page_end = f->p_first.page_start + len;
      f->p_first.last_decoded_sample = loc0;
   }
   f->next_seg = 0;
   return TRUE;
}